

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<pstore::exchange::import_ns::callbacks>::
consume_comment_start
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char c)

{
  undefined1 uVar1;
  bool bVar2;
  error_category *peVar3;
  int iVar4;
  undefined7 in_register_00000009;
  error_code err;
  
  iVar4 = (int)CONCAT71(in_register_00000009,c);
  if (iVar4 == 0x2a) {
    iVar4 = 6;
    uVar1 = (char)parser->extensions_ & multi_line_comments;
joined_r0x00116ef8:
    if (uVar1 == none) goto LAB_00116efa;
  }
  else {
    if (iVar4 == 0x2f) {
      iVar4 = 4;
      uVar1 = (char)parser->extensions_ & single_line_comments;
      goto joined_r0x00116ef8;
    }
LAB_00116efa:
    peVar3 = get_error_category();
    err._M_cat = peVar3;
    err._0_8_ = 8;
    bVar2 = parser<pstore::exchange::import_ns::callbacks>::set_error(parser,err);
    iVar4 = 1;
    if (!bVar2) goto LAB_00116f1c;
  }
  (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = iVar4;
LAB_00116f1c:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_*,_false>
  ._M_head_impl = (matcher<pstore::exchange::import_ns::callbacks> *)0x0;
  __return_storage_ptr__->second = true;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            whitespace_matcher<Callbacks>::consume_comment_start (parser<Callbacks> & parser,
                                                                  char c) {
                using details::char_set;
                if (c == char_set::slash &&
                    parser.extension_enabled (extensions::single_line_comments)) {
                    this->set_state (single_line_comment_state);
                } else if (c == char_set::star &&
                           parser.extension_enabled (extensions::multi_line_comments)) {
                    this->set_state (multi_line_comment_body_state);
                } else {
                    this->set_error (parser, error_code::expected_token);
                }
                return {nullptr, true}; // Consume this character.
            }